

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O3

DdNode * Extra_zddPrimes(DdManager *dd,DdNode *F)

{
  DdNode *pDVar1;
  
  do {
    dd->reordered = 0;
    pDVar1 = extraZddPrimes(dd,F);
    if (dd->reordered != 1) {
      return pDVar1;
    }
    puts("\nReordering in Extra_zddPrimes()");
  } while (dd->reordered == 1);
  return pDVar1;
}

Assistant:

DdNode * Extra_zddPrimes( DdManager * dd, DdNode * F )
{
    DdNode    *res;
    do {
        dd->reordered = 0;
        res = extraZddPrimes(dd, F);
        if ( dd->reordered == 1 )
            printf("\nReordering in Extra_zddPrimes()\n");
    } while (dd->reordered == 1);
    return(res);

}